

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

void Gia_PolynCoreCollect_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vNodes,Vec_Bit_t *vVisited)

{
  if ((iObj < 0) || (vVisited->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
  }
  if (((uint)vVisited->pArray[(uint)iObj >> 5] >> (iObj & 0x1fU) & 1) != 0) {
    return;
  }
  if (iObj < vVisited->nSize) {
    vVisited->pArray[(uint)iObj >> 5] =
         vVisited->pArray[(uint)iObj >> 5] | 1 << (sbyte)(iObj & 0x1fU);
    if (iObj < pGia->nObjs) {
      Gia_PolynCoreCollect_rec
                (pGia,iObj - (*(uint *)(pGia->pObjs + (uint)iObj) & 0x1fffffff),vNodes,vVisited);
      if (iObj < pGia->nObjs) {
        Gia_PolynCoreCollect_rec
                  (pGia,iObj - (*(uint *)&pGia->pObjs[(uint)iObj].field_0x4 & 0x1fffffff),vNodes,
                   vVisited);
        Vec_IntPush(vNodes,iObj);
        return;
      }
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

void Gia_PolynCoreCollect_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vNodes, Vec_Bit_t * vVisited )
{
    if ( Vec_BitEntry(vVisited, iObj) )
        return;
    Vec_BitSetEntry( vVisited, iObj, 1 );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId0p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId1p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Vec_IntPush( vNodes, iObj );
}